

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

Sto_Cls_t * Inta_ManPropagate(Inta_Man_t *p,int Start)

{
  abctime aVar1;
  Sto_Cls_t *pSVar2;
  abctime aVar3;
  abctime clk;
  int i;
  Sto_Cls_t *pClause;
  int Start_local;
  Inta_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  clk._4_4_ = Start;
  while( true ) {
    if (p->nTrailSize <= clk._4_4_) {
      aVar3 = Abc_Clock();
      p->timeBcp = (aVar3 - aVar1) + p->timeBcp;
      return (Sto_Cls_t *)0x0;
    }
    pSVar2 = Inta_ManPropagateOne(p,p->pTrail[clk._4_4_]);
    if (pSVar2 != (Sto_Cls_t *)0x0) break;
    clk._4_4_ = clk._4_4_ + 1;
  }
  aVar3 = Abc_Clock();
  p->timeBcp = (aVar3 - aVar1) + p->timeBcp;
  return pSVar2;
}

Assistant:

Sto_Cls_t * Inta_ManPropagate( Inta_Man_t * p, int Start )
{
    Sto_Cls_t * pClause;
    int i;
    abctime clk = Abc_Clock();
    for ( i = Start; i < p->nTrailSize; i++ )
    {
        pClause = Inta_ManPropagateOne( p, p->pTrail[i] );
        if ( pClause )
        {
p->timeBcp += Abc_Clock() - clk;
            return pClause;
        }
    }
p->timeBcp += Abc_Clock() - clk;
    return NULL;
}